

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall
xray_re::se_smart_cover::state_read(se_smart_cover *this,xr_packet *packet,uint16_t size)

{
  bool _enabled;
  vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
  *pvVar1;
  string *value;
  char *_id;
  loophole local_38;
  string *local_28;
  string *id;
  int i;
  uint16_t size_local;
  xr_packet *packet_local;
  se_smart_cover *this_local;
  
  id._6_2_ = size;
  _i = packet;
  packet_local = (xr_packet *)this;
  cse_smart_cover::state_read(&this->super_cse_smart_cover,packet,size);
  if (0x7f < (this->super_cse_smart_cover).super_cse_alife_dynamic_object.super_cse_alife_object.
             super_cse_abstract.m_version) {
    xr_packet::r_sz(_i,&this->m_last_description);
    xr_packet::r_u8(_i,&this->m_loopholes_count);
    if (this->m_loopholes_count != '\0') {
      pvVar1 = (vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
                *)operator_new(0x18);
      memset(pvVar1,0,0x18);
      std::
      vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      ::vector(pvVar1);
      this->m_loopholes = pvVar1;
      std::
      vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      ::reserve(this->m_loopholes,(ulong)this->m_loopholes_count);
      for (id._0_4_ = 0; (int)id < (int)(uint)this->m_loopholes_count; id._0_4_ = (int)id + 1) {
        value = (string *)operator_new(0x20);
        std::__cxx11::string::string((string *)value);
        local_28 = value;
        xr_packet::r_sz(_i,value);
        pvVar1 = this->m_loopholes;
        _id = (char *)std::__cxx11::string::c_str();
        _enabled = xr_packet::r_bool(_i);
        loophole::loophole(&local_38,_id,_enabled);
        std::
        vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
        ::push_back(pvVar1,&local_38);
      }
    }
  }
  return;
}

Assistant:

void se_smart_cover::state_read(xr_packet& packet, uint16_t size)
{
	cse_smart_cover::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		packet.r_sz(m_last_description);
		packet.r_u8(m_loopholes_count);

		if (m_loopholes_count > 0)
		{
			m_loopholes = new std::vector<loophole>();

			m_loopholes->reserve(m_loopholes_count);

			for (int i = 0; i < m_loopholes_count; ++i)
			{
				std::string *id = new std::string;
				packet.r_sz(*id);
				m_loopholes->push_back(loophole(id->c_str(), packet.r_bool()));
			}
		}
	}
}